

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O1

void __thiscall
test_matrix_dense_matrix_matrix_multiplication_assignment_Test::TestBody
          (test_matrix_dense_matrix_matrix_multiplication_assignment_Test *this)

{
  void *pvVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  pointer *__ptr;
  long lVar9;
  Matrix_Dense<double,_2UL,_3UL> incorrect;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix_0;
  DeathTest *gtest_dt;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix_1;
  undefined1 local_218 [16];
  pointer local_208;
  undefined8 uStack_200;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_1f8;
  long lStack_1e0;
  undefined1 local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1d0;
  undefined1 local_1c8 [16];
  double local_1b8;
  double dStack_1b0;
  Vector_Dense<double,_0UL> local_1a8;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_190;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_178;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_158;
  pointer local_148;
  double dStack_140;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_138;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_120;
  initializer_list<double> local_108;
  undefined1 local_f8 [16];
  Matrix_Dense<double,_2UL,_2UL> local_e8;
  initializer_list<double> local_c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_98;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_80;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_68;
  double local_50 [2];
  initializer_list<double> local_40;
  
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_218;
  local_218._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = 9.88131291682493e-324;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)local_1d8,(initializer_list<double> *)&local_e8);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_178;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1c8 + 8),(initializer_list<double> *)&local_1f8);
  local_158._M_array = (iterator)local_1d8;
  local_158._M_len = 2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_190,&local_158);
  lVar9 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_1f8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_1e0 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  local_218._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x4014000000000000;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4018000000000000;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = 9.88131291682493e-324;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_218;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)local_1d8,(initializer_list<double> *)&local_e8);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_401c000000000000;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4020000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_178;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1c8 + 8),(initializer_list<double> *)&local_1f8);
  local_158._M_array = (iterator)local_1d8;
  local_158._M_len = 2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_138,&local_158);
  lVar9 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_1f8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_1e0 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  local_218._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = 9.88131291682493e-324;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_218;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1d8,(initializer_list<double> *)&local_e8);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_178;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1c8,(initializer_list<double> *)&local_1f8);
  local_148 = (pointer)local_1c8._0_8_;
  dStack_140 = (double)local_1c8._8_8_;
  local_158._M_array = (iterator)local_1d8;
  local_158._M_len = (size_type)pbStack_1d0;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4014000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4018000000000000;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_218._0_8_ = &local_1f8;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1d8,(initializer_list<double> *)local_218);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_120;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_401c000000000000;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4020000000000000;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1c8,(initializer_list<double> *)&local_178);
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].super_array<double,_2UL>.
  _M_elems[0] = (double)local_1c8._0_8_;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].super_array<double,_2UL>.
  _M_elems[1] = (double)local_1c8._8_8_;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[0] = (double)local_1d8;
  local_e8.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[0].super_array<double,_2UL>.
  _M_elems[1] = (double)pbStack_1d0;
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&local_190,(Matrix_Dense<double,_0UL,_0UL> *)&local_138
            );
  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
            ((Matrix_Dense<double,2ul,2ul> *)&local_158,&local_e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][0]","19",
             **(double **)
               local_190.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,19.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((initializer_list<double> *)local_218._0_8_ != (initializer_list<double> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][1]","22",
             *(double *)
              ((long)*(double *)
                      local_190.
                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8),22.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((initializer_list<double> *)local_218._0_8_ != (initializer_list<double> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][0]","43",
             **(double **)
               ((long)local_190.
                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x18),43.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfd,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_218._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][1]","50",
             *(double *)
              ((long)*(double *)
                      ((long)local_190.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x18) + 8),50.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xfe,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[0][0]","19",(double)local_158._M_array,19.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xff,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[0][1]","22",(double)local_158._M_len,22.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x100,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[1][0]","43",(double)local_148,43.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x101,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[1][1]","50",dStack_140,50.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x102,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  local_f8._0_8_ = (iterator)0x3ff0000000000000;
  local_f8._8_8_ = (pointer)0x4000000000000000;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)local_1d8,(initializer_list<double> *)&local_120);
  local_108._M_array = (iterator)0x4008000000000000;
  local_108._M_len = 0x4010000000000000;
  local_c0._M_len = 2;
  local_c0._M_array = (iterator)&local_108;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1c8 + 8),&local_c0);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_1f8,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&local_178);
  local_208 = local_190.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_218._8_8_ =
       local_190.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_218._0_8_ =
       local_190.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_190.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1f8.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_190.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1f8.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_190.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1f8.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           *)local_218);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_1f8);
  lVar9 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_1f8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_1e0 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_218._0_8_ = &local_1f8;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1d8,(initializer_list<double> *)local_218);
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4010000000000000;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_120;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_1c8,(initializer_list<double> *)&local_178);
  local_148 = (pointer)local_1c8._0_8_;
  dStack_140 = (double)local_1c8._8_8_;
  local_158._M_array = (iterator)local_1d8;
  local_158._M_len = (size_type)pbStack_1d0;
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&local_190,&local_e8);
  Disa::Matrix_Dense<double,2ul,2ul>::operator*=
            ((Matrix_Dense<double,2ul,2ul> *)&local_158,(Matrix_Dense<double,_0UL,_0UL> *)&local_138
            );
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][0]","19",
             **(double **)
               local_190.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,19.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x109,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][1]","22",
             *(double *)
              ((long)*(double *)
                      local_190.
                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8),22.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][0]","43",
             **(double **)
               ((long)local_190.
                      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x18),43.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_218._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][1]","50",
             *(double *)
              ((long)*(double *)
                      ((long)local_190.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x18) + 8),50.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[0][0]","19",(double)local_158._M_array,19.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[0][1]","22",(double)local_158._M_len,22.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[1][0]","43",(double)local_148,43.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x10f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"static_matrix_0[1][1]","50",dStack_140,50.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x110,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  local_f8._0_8_ = (iterator)0x3ff0000000000000;
  local_f8._8_8_ = (pointer)0x4000000000000000;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)local_1d8,(initializer_list<double> *)&local_120);
  local_108._M_array = (iterator)0x4008000000000000;
  local_108._M_len = 0x4010000000000000;
  local_c0._M_len = 2;
  local_c0._M_array = (iterator)&local_108;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1c8 + 8),&local_c0);
  local_40._M_array = local_50;
  local_50[0] = 5.0;
  local_50[1] = 6.0;
  local_40._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_1a8,&local_40);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_1f8,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)&local_178);
  local_208 = local_190.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_218._8_8_ =
       local_190.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_218._0_8_ =
       local_190.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_190.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1f8.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_190.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1f8.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_190.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1f8.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           *)local_218);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_1f8);
  lVar9 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_1f8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_1e0 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  local_208 = (pointer)0x4022000000000000;
  uStack_200 = 0x4024000000000000;
  local_218._0_8_ = &DAT_401c000000000000;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4020000000000000;
  local_c0._M_len = 4;
  local_c0._M_array = (iterator)local_218;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_1d8,&local_c0);
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  lStack_1e0 = 0x402c000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4026000000000000;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4028000000000000;
  local_108._M_len = 4;
  local_108._M_array = (iterator)&local_1f8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_1c8 + 8),&local_108);
  local_f8._0_8_ = local_1d8;
  local_f8._8_8_ = (pointer)0x2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_120,
             (initializer_list<Disa::Vector_Dense<double,_0UL>_> *)local_f8);
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_138.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_138.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_178.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_138.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_138.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_120.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_138.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_120.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_138.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_120.
       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_178);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_120);
  lVar9 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_1f8.
                               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_1e0 + lVar9) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  Disa::Matrix_Dense<double,0ul,0ul>::operator*=
            ((Matrix_Dense<double,0ul,0ul> *)&local_190,(Matrix_Dense<double,_0UL,_0UL> *)&local_138
            );
  local_218._0_8_ =
       ((long)local_190.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_190.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1f8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1d8,"dynamic_matrix_0.size_row()","3",(unsigned_long *)local_218,
             (int *)&local_1f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x116,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  if (local_190.
      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_190.
      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_218._0_8_ =
         (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          )0x0;
  }
  else {
    local_218._0_8_ =
         (long)((local_190.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)((local_190.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start >> 3;
  }
  local_1f8.
  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1f8.
                         super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1d8,"dynamic_matrix_0.size_column()","4",(unsigned_long *)local_218,
             (int *)&local_1f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x117,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][0]","29",
             *((local_190.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,29.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x118,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_218._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][1]","32",
             ((local_190.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],32.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x119,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][2]","35",
             ((local_190.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],35.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[0][3]","38",
             ((local_190.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3],38.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][0]","65",
             *local_190.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,65.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][1]","72",
             *(double *)
              ((long)local_190.
                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 8),72.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][2]","79",
             *(double *)
              ((long)local_190.
                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x10),79.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[1][3]","86",
             *(double *)
              ((long)local_190.
                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x18),86.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x11f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[2][0]","101",
             *local_190.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,101.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x120,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[2][1]","112",
             *(double *)
              ((long)local_190.
                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 8),112.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x121,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[2][2]","123",
             *(double *)
              ((long)local_190.
                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x10),123.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x122,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1d8,"dynamic_matrix_0[2][3]","134",
             *(double *)
              ((long)local_190.
                     super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x18),134.0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (pbStack_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x123,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  Disa::Matrix_Dense<double,_0UL,_0UL>::resize((Matrix_Dense<double,_0UL,_0UL> *)&local_190,1,1);
  local_1b8 = 0.0;
  dStack_1b0 = 0.0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = 0.0;
  local_1d8 = (undefined1  [8])0x0;
  pbStack_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1f8.
    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16238a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_218,
               (testing *)&local_1f8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_68,(PolymorphicMatcher *)local_218);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("dynamic_matrix_1 *= incorrect",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x127,(DeathTest **)&local_178);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_68);
    pVVar2 = local_178.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = true;
    if (bVar5) {
      if (local_178.
          super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar7 = (*(code *)((local_178.
                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[2])
                          (local_178.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        pVVar3 = local_178.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar7 == 0) {
          iVar7 = (*(code *)((local_178.
                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[3])
                            (local_178.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar6 = (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[4])(pVVar3,bVar4);
          if (cVar6 != '\0') goto LAB_0011650d;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                        ((Matrix_Dense<double,0ul,0ul> *)&local_138,
                         (Matrix_Dense<double,_2UL,_3UL> *)local_1d8);
            }
            (*(code *)((local_178.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])
                      (local_178.
                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,2);
            (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])(pVVar3,0);
          }
LAB_0011650d:
          bVar4 = false;
          bVar5 = true;
        }
        (*(code *)(pVVar2->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1])(pVVar2);
        if (!bVar5) goto LAB_00116520;
      }
      bVar4 = false;
    }
LAB_00116520:
    if (bVar4) goto LAB_00116524;
  }
  else {
LAB_00116524:
    testing::Message::Message((Message *)local_218);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x127,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1f8.
    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16238a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_218,
               (testing *)&local_1f8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_80,(PolymorphicMatcher *)local_218);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("dynamic_matrix_1 *= dynamic_matrix_0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_80,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x128,(DeathTest **)&local_178);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_80);
    pVVar2 = local_178.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = true;
    if (bVar5) {
      if (local_178.
          super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar7 = (*(code *)((local_178.
                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[2])
                          (local_178.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        pVVar3 = local_178.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar7 == 0) {
          iVar7 = (*(code *)((local_178.
                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[3])
                            (local_178.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar6 = (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[4])(pVVar3,bVar4);
          if (cVar6 != '\0') goto LAB_00116691;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::Matrix_Dense<double,0ul,0ul>::operator*=
                        ((Matrix_Dense<double,0ul,0ul> *)&local_138,
                         (Matrix_Dense<double,_0UL,_0UL> *)&local_190);
            }
            (*(code *)((local_178.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])
                      (local_178.
                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,2);
            (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])(pVVar3,0);
          }
LAB_00116691:
          bVar4 = false;
          bVar5 = true;
        }
        (*(code *)(pVVar2->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1])(pVVar2);
        if (!bVar5) goto LAB_001166a4;
      }
      bVar4 = false;
    }
LAB_001166a4:
    if (bVar4) goto LAB_001166a8;
  }
  else {
LAB_001166a8:
    testing::Message::Message((Message *)local_218);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x128,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1f8.
    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16238a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_218,
               (testing *)&local_1f8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_98,(PolymorphicMatcher *)local_218);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("static_matrix_0 *= incorrect",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x129,(DeathTest **)&local_178);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_98);
    pVVar2 = local_178.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar7 = 6;
    if (bVar4) {
      if (local_178.
          super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar7 = (*(code *)((local_178.
                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[2])
                          (local_178.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        pVVar3 = local_178.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar7 == 0) {
          iVar7 = (*(code *)((local_178.
                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[3])
                            (local_178.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar6 = (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[4])(pVVar3,bVar4);
          if (cVar6 != '\0') goto LAB_00116812;
          iVar7 = 6;
          bVar4 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                        ((Matrix_Dense<double,2ul,2ul> *)&local_158,
                         (Matrix_Dense<double,_2UL,_3UL> *)local_1d8);
            }
            (*(code *)((local_178.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])
                      (local_178.
                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,2);
            (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])(pVVar3,0);
          }
LAB_00116812:
          iVar7 = 0;
          bVar4 = true;
        }
        (*(code *)(pVVar2->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1])(pVVar2);
        if (!bVar4) goto LAB_00116825;
      }
      iVar7 = 0;
    }
LAB_00116825:
    if (iVar7 != 0) goto LAB_00116829;
  }
  else {
LAB_00116829:
    testing::Message::Message((Message *)local_218);
    pcVar8 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x129,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(double *)local_218._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_1f8.
    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16238a;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_218,
               (testing *)&local_1f8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b0,(PolymorphicMatcher *)local_218);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("static_matrix_0 *= dynamic_matrix_0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                       ,0x12a,(DeathTest **)&local_178);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b0);
    pVVar2 = local_178.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = true;
    if (bVar5) {
      if (local_178.
          super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar7 = (*(code *)((local_178.
                            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<double,_std::allocator<double>_>).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[2])
                          (local_178.
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        pVVar3 = local_178.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar7 == 0) {
          iVar7 = (*(code *)((local_178.
                              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[3])
                            (local_178.
                             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar6 = (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[4])(pVVar3,bVar4);
          if (cVar6 != '\0') goto LAB_00116996;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              Disa::Matrix_Dense<double,2ul,2ul>::operator*=
                        ((Matrix_Dense<double,2ul,2ul> *)&local_158,
                         (Matrix_Dense<double,_0UL,_0UL> *)&local_190);
            }
            (*(code *)((local_178.
                        super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])
                      (local_178.
                       super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,2);
            (*(code *)(pVVar3->super_vector<double,_std::allocator<double>_>).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[5])(pVVar3,0);
          }
LAB_00116996:
          bVar4 = false;
          bVar5 = true;
        }
        (*(code *)(pVVar2->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1])(pVVar2);
        if (!bVar5) goto LAB_001169a9;
      }
      bVar4 = false;
    }
LAB_001169a9:
    if (!bVar4) goto LAB_001169fe;
  }
  testing::Message::Message((Message *)local_218);
  pcVar8 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
             ,0x12a,pcVar8);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_218);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)((long)*(double *)local_218._0_8_ + 8))();
  }
LAB_001169fe:
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_138);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_190);
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_multiplication_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{5, 6}, {7, 8}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{5, 6}, {7, 8}};

  dynamic_matrix_0 *= dynamic_matrix_1;
  static_matrix_0 *= static_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // reset
  dynamic_matrix_0 = {{1, 2}, {3, 4}};
  static_matrix_0 = {{1, 2}, {3, 4}};
  dynamic_matrix_0 *= static_matrix_1;
  static_matrix_0 *= dynamic_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 50);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], 19);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 22);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 43);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 50);

  // non-square
  dynamic_matrix_0 = {{1, 2}, {3, 4}, {5, 6}};
  dynamic_matrix_1 = {{7, 8, 9, 10}, {11, 12, 13, 14}};
  dynamic_matrix_0 *= dynamic_matrix_1;
  EXPECT_EQ(dynamic_matrix_0.size_row(), 3);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 4);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], 29);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 32);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][2], 35);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][3], 38);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 65);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 72);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][2], 79);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][3], 86);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][0], 101);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][1], 112);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][2], 123);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[2][3], 134);

  dynamic_matrix_0.resize(1, 1);
  Matrix_Dense<Scalar, 2, 3> incorrect;
  EXPECT_DEATH(dynamic_matrix_1 *= incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_1 *= dynamic_matrix_0, "./*");
  EXPECT_DEATH(static_matrix_0 *= incorrect, "./*");
  EXPECT_DEATH(static_matrix_0 *= dynamic_matrix_0, "./*");
}